

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O2

void pipe_client_connect_cb(uv_connect_t *req,int status)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (req == &connect_req) {
    if (status == 0) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      uv_close(&pipe_client,pipe_close_cb);
      uv_close(&pipe_server,pipe_close_cb);
      return;
    }
    pcVar1 = "exit_status == 0";
    uStack_10 = 0x2e;
  }
  else {
    pcVar1 = "conn_req == &connect_req";
    uStack_10 = 0x2d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-server-close.c"
          ,uStack_10,pcVar1 + 5);
  abort();
}

Assistant:

static void pipe_client_connect_cb(uv_connect_t* req, int status) {
  char buf[1024];
  size_t len;
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  pipe_client_connect_cb_called++;


  uv_close((uv_handle_t*) &pipe_client, pipe_close_cb);
  uv_close((uv_handle_t*) &pipe_server, pipe_close_cb);
}